

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

void __thiscall fasttext::Matrix::addRow(Matrix *this,Vector *vec,int64_t i,real a)

{
  ulong uVar1;
  real *prVar2;
  real *prVar3;
  undefined1 auVar4 [16];
  uint __line;
  ulong uVar5;
  char *__assertion;
  undefined1 in_register_00001204 [12];
  
  if (i < 0) {
    __assertion = "i >= 0";
    __line = 0x47;
  }
  else if (i < this->m_) {
    uVar1 = vec->m_;
    if (uVar1 == this->n_) {
      prVar2 = vec->data_;
      prVar3 = this->data_;
      for (uVar5 = 0; (~((long)uVar1 >> 0x3f) & uVar1) != uVar5; uVar5 = uVar5 + 1) {
        auVar4._4_12_ = in_register_00001204;
        auVar4._0_4_ = a;
        auVar4 = vfmadd213ss_fma(ZEXT416((uint)prVar2[uVar5]),auVar4,
                                 ZEXT416((uint)prVar3[i * uVar1 + uVar5]));
        prVar3[i * uVar1 + uVar5] = auVar4._0_4_;
      }
      return;
    }
    __assertion = "vec.m_ == n_";
    __line = 0x49;
  }
  else {
    __assertion = "i < m_";
    __line = 0x48;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/matrix.cc"
                ,__line,"void fasttext::Matrix::addRow(const Vector &, int64_t, real)");
}

Assistant:

void Matrix::addRow(const Vector& vec, int64_t i, real a) {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.m_ == n_);
  for (int64_t j = 0; j < n_; j++) {
    data_[i * n_ + j] += a * vec.data_[j];
  }
  /*std::ofstream ofs("matrix.txt", std::ios_base::app);
  for (int64_t i = 0; i < 20; i++) {
    ofs << data_[i] << " ";
  }
  ofs << std::endl;*/
}